

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void FStat::PrintStat(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  FStat *pFVar4;
  int y;
  int iVar5;
  int iVar6;
  FString stattext;
  FString local_38;
  
  if (FirstStat != (FStat *)0x0) {
    iVar5 = ConFont->FontHeight + 1;
    y = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    iVar6 = 0;
    pFVar4 = FirstStat;
    do {
      if (pFVar4->m_Active == true) {
        (*pFVar4->_vptr_FStat[2])(&local_38,pFVar4);
        if ((ulong)*(uint *)(local_38.Chars + -0xc) != 0) {
          y = y - iVar5;
          lVar1 = (ulong)*(uint *)(local_38.Chars + -0xc) - 1;
          if (lVar1 != 0) {
            lVar2 = 0;
            do {
              iVar3 = 0;
              if (local_38.Chars[lVar2] == '\n') {
                iVar3 = iVar5;
              }
              y = y - iVar3;
              lVar2 = lVar2 + 1;
            } while ((uint)lVar2 < (uint)lVar1);
          }
          DCanvas::DrawText((DCanvas *)screen,ConFont,3,5,y,local_38.Chars,0);
          iVar6 = iVar6 + 1;
        }
        FString::~FString(&local_38);
      }
      pFVar4 = pFVar4->m_Next;
    } while (pFVar4 != (FStat *)0x0);
    if (iVar6 != 0) {
      ST_SetNeedRefresh();
    }
  }
  return;
}

Assistant:

void FStat::PrintStat ()
{
	int fontheight = ConFont->GetHeight() + 1;
	int y = SCREENHEIGHT;
	int count = 0;

	for (FStat *stat = FirstStat; stat != NULL; stat = stat->m_Next)
	{
		if (stat->m_Active)
		{
			FString stattext(stat->GetStats());

			if (stattext.Len() > 0)
			{
				y -= fontheight;	// there's at least one line of text
				for (unsigned i = 0; i < stattext.Len()-1; i++)
				{
					// Count number of linefeeds but ignore terminating ones.
					if (stattext[i] == '\n') y -= fontheight;
				}
				screen->DrawText(ConFont, CR_GREEN, 5, y, stattext, TAG_DONE);
				count++;
			}
		}
	}
	if (count)
	{
		ST_SetNeedRefresh();
	}
}